

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpInputStream::Message> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readMessage(HttpInputStreamImpl *this)

{
  Coroutine<kj::HttpInputStream::Message> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  ArrayPtr<char> content;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  undefined8 in_RSI;
  HttpHeaders *this_02;
  DebugExpression<bool> _kjCondition;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  undefined4 local_40 [2];
  undefined4 local_38;
  
  handle._M_fr_ptr = operator_new(0x4b8);
  *(code **)handle._M_fr_ptr = readMessage;
  *(code **)((long)handle._M_fr_ptr + 8) = readMessage;
  this_00 = (Coroutine<kj::HttpInputStream::Message> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x4a8) = in_RSI;
  body.disposer = (Disposer *)anon_var_dwarf_67f91a;
  body.ptr = (AsyncInputStream *)s_readMessage_0043ca1b;
  location.function = "readMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5af;
  location.columnNumber = 0x18;
  kj::_::Coroutine<kj::HttpInputStream::Message>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::HttpInputStream::Message>::get_return_object
            ((Coroutine<kj::HttpInputStream::Message> *)this);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x4a0);
  readMessageHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)handle._M_fr_ptr + 0x250);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x4b0) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x448),__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    _kjCondition.value =
         ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
         ((long)handle._M_fr_ptr + 0x448))->tag == 1;
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
                ((Fault *)&body,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5b1,FAILED,"textOrError.is<kj::ArrayPtr<char>>()","_kjCondition,\"bad message\""
                 ,&_kjCondition,(char (*) [12])"bad message");
      kj::_::Debug::Fault::fatal((Fault *)&body);
    }
    content = *(ArrayPtr<char> *)((long)handle._M_fr_ptr + 0x450);
    this_02 = (HttpHeaders *)(*(long *)((long)handle._M_fr_ptr + 0x4a8) + 0x48);
    HttpHeaders::clear(this_02);
    _kjCondition.value = HttpHeaders::tryParse(this_02,content);
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
                ((Fault *)&body,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5b4,FAILED,"headers.tryParse(text)","_kjCondition,\"bad message\"",&_kjCondition
                 ,(char (*) [12])"bad message");
      kj::_::Debug::Fault::fatal((Fault *)&body);
    }
    local_40[0] = 1;
    local_38 = 0;
    getEntityBody((HttpInputStreamImpl *)&body,
                  (RequestOrResponse)*(undefined8 *)((long)handle._M_fr_ptr + 0x4a8),
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)local_40,
                  (HttpHeaders *)0x0);
    local_40[0] = 0;
    *(HttpHeaders **)((long)handle._M_fr_ptr + 0x488) = this_02;
    *(Disposer **)((long)handle._M_fr_ptr + 0x490) = body.disposer;
    *(AsyncInputStream **)((long)handle._M_fr_ptr + 0x498) = body.ptr;
    body.ptr = (AsyncInputStream *)0x0;
    kj::_::Coroutine<kj::HttpInputStream::Message>::fulfill
              (this_00,(FixVoid<kj::HttpInputStream::Message> *)((long)handle._M_fr_ptr + 0x488));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x490));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&body);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x4b0) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> readMessage() override {
    auto textOrError = co_await readMessageHeaders();
    KJ_REQUIRE(textOrError.is<kj::ArrayPtr<char>>(), "bad message");
    auto text = textOrError.get<kj::ArrayPtr<char>>();
    headers.clear();
    KJ_REQUIRE(headers.tryParse(text), "bad message");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, HttpMethod::GET, 0, headers);

    co_return { headers, kj::mv(body) };
  }